

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

archive * archive_write_new(void)

{
  archive_vtable_conflict *paVar1;
  char *__s;
  uchar *nulls;
  archive_write *a;
  archive *local_8;
  
  local_8 = (archive *)malloc(0x118);
  if (local_8 == (archive *)0x0) {
    local_8 = (archive *)0x0;
  }
  else {
    memset(local_8,0,0x118);
    local_8->magic = 0xb0c5c0de;
    local_8->state = 1;
    paVar1 = archive_write_vtable();
    local_8->vtable = paVar1;
    *(undefined4 *)&local_8[1].error_string.length = 0x2800;
    *(undefined4 *)((long)&local_8[1].error_string.length + 4) = 0xffffffff;
    *(undefined8 *)&local_8[1].compression_code = 0x400;
    __s = (char *)malloc(*(size_t *)&local_8[1].compression_code);
    if (__s == (char *)0x0) {
      free(local_8);
      local_8 = (archive *)0x0;
    }
    else {
      memset(__s,0,*(size_t *)&local_8[1].compression_code);
      local_8[1].archive_format_name = __s;
    }
  }
  return local_8;
}

Assistant:

struct archive *
archive_write_new(void)
{
	struct archive_write *a;
	unsigned char *nulls;

	a = (struct archive_write *)malloc(sizeof(*a));
	if (a == NULL)
		return (NULL);
	memset(a, 0, sizeof(*a));
	a->archive.magic = ARCHIVE_WRITE_MAGIC;
	a->archive.state = ARCHIVE_STATE_NEW;
	a->archive.vtable = archive_write_vtable();
	/*
	 * The value 10240 here matches the traditional tar default,
	 * but is otherwise arbitrary.
	 * TODO: Set the default block size from the format selected.
	 */
	a->bytes_per_block = 10240;
	a->bytes_in_last_block = -1;	/* Default */

	/* Initialize a block of nulls for padding purposes. */
	a->null_length = 1024;
	nulls = (unsigned char *)malloc(a->null_length);
	if (nulls == NULL) {
		free(a);
		return (NULL);
	}
	memset(nulls, 0, a->null_length);
	a->nulls = nulls;
	return (&a->archive);
}